

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_value_validate(ly_ctx *ctx,lysc_node *node,char *value,size_t value_len,
                        LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints)

{
  lysc_node *plVar1;
  ly_ctx *local_b8;
  ly_ctx *local_a8;
  lysc_type *type;
  lyd_value storage;
  ly_err_item *err;
  LY_ERR rc;
  void *prefix_data_local;
  LY_VALUE_FORMAT format_local;
  size_t value_len_local;
  char *value_local;
  lysc_node *node_local;
  ly_ctx *ctx_local;
  
  storage.field_2._16_8_ = 0;
  if (node == (lysc_node *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","ly_value_validate");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if ((node->nodetype & 0xc) == 0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","ly_value_validate");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    plVar1 = node[1].parent;
    local_a8 = ctx;
    if (ctx == (ly_ctx *)0x0) {
      local_a8 = node->module->ctx;
    }
    err._4_4_ = (*(code *)plVar1->parent->module)
                          (local_a8,plVar1,value,value_len,0,format,prefix_data,hints,node,&type,0,
                           (undefined1 *)((long)&storage.field_2 + 0x10));
    if (err._4_4_ == LY_EINCOMPLETE) {
      err._4_4_ = LY_SUCCESS;
    }
    else if ((err._4_4_ != LY_SUCCESS) && (storage.field_2._16_8_ != 0)) {
      if (ctx != (ly_ctx *)0x0) {
        ly_err_print_build_path(ctx,(lyd_node *)0x0,node,(ly_err_item *)storage.field_2._16_8_);
      }
      ly_err_free((void *)storage.field_2._16_8_);
    }
    if (err._4_4_ == LY_SUCCESS) {
      local_b8 = ctx;
      if (ctx == (ly_ctx *)0x0) {
        local_b8 = node->module->ctx;
      }
      (*(code *)plVar1->parent->ref)(local_b8,&type);
    }
    ctx_local._4_4_ = err._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
ly_value_validate(const struct ly_ctx *ctx, const struct lysc_node *node, const char *value, size_t value_len,
        LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints)
{
    LY_ERR rc = LY_SUCCESS;
    struct ly_err_item *err = NULL;
    struct lyd_value storage;
    struct lysc_type *type;

    LY_CHECK_ARG_RET(ctx, node, LY_EINVAL);

    if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGARG(ctx, node);
        return LY_EINVAL;
    }

    type = ((struct lysc_node_leaf *)node)->type;
    rc = type->plugin->store(ctx ? ctx : node->module->ctx, type, value, value_len, 0, format, prefix_data, hints, node,
            &storage, NULL, &err);
    if (rc == LY_EINCOMPLETE) {
        /* actually success since we do not provide the context tree and call validation with
         * LY_TYPE_OPTS_INCOMPLETE_DATA */
        rc = LY_SUCCESS;
    } else if (rc && err) {
        if (ctx) {
            /* log only in case the ctx was provided as input parameter */
            ly_err_print_build_path(ctx, NULL, node, err);
        }
        ly_err_free(err);
    }

    if (!rc) {
        type->plugin->free(ctx ? ctx : node->module->ctx, &storage);
    }
    return rc;
}